

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint32 __thiscall Js::FunctionBody::GetEndNonTempLocalIndex(FunctionBody *this)

{
  RegSlot RVar1;
  
  RVar1 = GetFirstTmpRegister(this);
  if (RVar1 != 0xffffffff) {
    return RVar1;
  }
  RVar1 = GetLocalsCount(this);
  return RVar1;
}

Assistant:

uint32
    FunctionBody::GetEndNonTempLocalIndex()
    {
        // It will give the index on which current non temp locals ends, which is a first temp reg.
        RegSlot firstTmpReg = GetFirstTmpRegister();
        return firstTmpReg != Constants::NoRegister ? firstTmpReg : GetLocalsCount();
    }